

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pffft.c
# Opt level: O0

void passf4_ps(int ido,int l1,v4sf *cc,v4sf *ch,float *wa1,float *wa2,float *wa3,float fsign)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  v4sf tmp_2;
  v4sf tmp_1;
  v4sf tmp;
  float wi3;
  float wr3;
  float wi2;
  float wr2;
  float wi1;
  float wr1;
  int l1ido;
  v4sf tr4;
  v4sf tr3;
  v4sf tr2;
  v4sf tr1;
  v4sf ti4;
  v4sf ti3;
  v4sf ti2;
  v4sf ti1;
  v4sf cr4;
  v4sf cr3;
  v4sf cr2;
  v4sf ci4;
  v4sf ci3;
  v4sf ci2;
  int local_8fc;
  int local_8f8;
  int k;
  int i;
  float fsign_local;
  float *wa2_local;
  float *wa1_local;
  v4sf *ch_local;
  v4sf *cc_local;
  int l1_local;
  int ido_local;
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float local_7c8;
  float fStack_7c4;
  float fStack_7c0;
  float fStack_7bc;
  float local_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float local_788;
  float fStack_784;
  float fStack_780;
  float fStack_77c;
  float local_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  iVar5 = l1 * ido;
  wa1_local = *ch;
  ch_local = cc;
  if (ido == 2) {
    for (local_8fc = 0; local_8fc < iVar5; local_8fc = local_8fc + 2) {
      local_18 = (float)*(undefined8 *)*ch_local;
      fStack_14 = (float)((ulong)*(undefined8 *)*ch_local >> 0x20);
      fStack_10 = (float)*(undefined8 *)(*ch_local + 2);
      fStack_c = (float)((ulong)*(undefined8 *)(*ch_local + 2) >> 0x20);
      local_28 = (float)*(undefined8 *)ch_local[4];
      fStack_24 = (float)((ulong)*(undefined8 *)ch_local[4] >> 0x20);
      fStack_20 = (float)*(undefined8 *)(ch_local[4] + 2);
      fStack_1c = (float)((ulong)*(undefined8 *)(ch_local[4] + 2) >> 0x20);
      local_678 = (float)*(undefined8 *)*ch_local;
      fStack_674 = (float)((ulong)*(undefined8 *)*ch_local >> 0x20);
      fStack_670 = (float)*(undefined8 *)(*ch_local + 2);
      fStack_66c = (float)((ulong)*(undefined8 *)(*ch_local + 2) >> 0x20);
      local_688 = (float)*(undefined8 *)ch_local[4];
      fStack_684 = (float)((ulong)*(undefined8 *)ch_local[4] >> 0x20);
      fStack_680 = (float)*(undefined8 *)(ch_local[4] + 2);
      fStack_67c = (float)((ulong)*(undefined8 *)(ch_local[4] + 2) >> 0x20);
      local_38 = (float)*(undefined8 *)ch_local[1];
      fStack_34 = (float)((ulong)*(undefined8 *)ch_local[1] >> 0x20);
      fStack_30 = (float)*(undefined8 *)(ch_local[1] + 2);
      fStack_2c = (float)((ulong)*(undefined8 *)(ch_local[1] + 2) >> 0x20);
      local_48 = (float)*(undefined8 *)ch_local[5];
      fStack_44 = (float)((ulong)*(undefined8 *)ch_local[5] >> 0x20);
      fStack_40 = (float)*(undefined8 *)(ch_local[5] + 2);
      fStack_3c = (float)((ulong)*(undefined8 *)(ch_local[5] + 2) >> 0x20);
      local_698 = (float)*(undefined8 *)ch_local[1];
      fStack_694 = (float)((ulong)*(undefined8 *)ch_local[1] >> 0x20);
      fStack_690 = (float)*(undefined8 *)(ch_local[1] + 2);
      fStack_68c = (float)((ulong)*(undefined8 *)(ch_local[1] + 2) >> 0x20);
      local_6a8 = (float)*(undefined8 *)ch_local[5];
      fStack_6a4 = (float)((ulong)*(undefined8 *)ch_local[5] >> 0x20);
      fStack_6a0 = (float)*(undefined8 *)(ch_local[5] + 2);
      fStack_69c = (float)((ulong)*(undefined8 *)(ch_local[5] + 2) >> 0x20);
      local_58 = (float)*(undefined8 *)ch_local[2];
      fStack_54 = (float)((ulong)*(undefined8 *)ch_local[2] >> 0x20);
      fStack_50 = (float)*(undefined8 *)(ch_local[2] + 2);
      fStack_4c = (float)((ulong)*(undefined8 *)(ch_local[2] + 2) >> 0x20);
      local_68 = (float)*(undefined8 *)ch_local[6];
      fStack_64 = (float)((ulong)*(undefined8 *)ch_local[6] >> 0x20);
      fStack_60 = (float)*(undefined8 *)(ch_local[6] + 2);
      fStack_5c = (float)((ulong)*(undefined8 *)(ch_local[6] + 2) >> 0x20);
      fVar7 = (local_58 - local_68) * fsign;
      fVar11 = (fStack_54 - fStack_64) * fsign;
      fVar19 = (fStack_50 - fStack_60) * fsign;
      fVar27 = (fStack_4c - fStack_5c) * fsign;
      local_78 = (float)*(undefined8 *)ch_local[7];
      fStack_74 = (float)((ulong)*(undefined8 *)ch_local[7] >> 0x20);
      fStack_70 = (float)*(undefined8 *)(ch_local[7] + 2);
      fStack_6c = (float)((ulong)*(undefined8 *)(ch_local[7] + 2) >> 0x20);
      local_88 = (float)*(undefined8 *)ch_local[3];
      fStack_84 = (float)((ulong)*(undefined8 *)ch_local[3] >> 0x20);
      fStack_80 = (float)*(undefined8 *)(ch_local[3] + 2);
      fStack_7c = (float)((ulong)*(undefined8 *)(ch_local[3] + 2) >> 0x20);
      fVar8 = (local_78 - local_88) * fsign;
      fVar12 = (fStack_74 - fStack_84) * fsign;
      fVar20 = (fStack_70 - fStack_80) * fsign;
      fVar28 = (fStack_6c - fStack_7c) * fsign;
      local_6b8 = (float)*(undefined8 *)ch_local[2];
      fStack_6b4 = (float)((ulong)*(undefined8 *)ch_local[2] >> 0x20);
      fStack_6b0 = (float)*(undefined8 *)(ch_local[2] + 2);
      fStack_6ac = (float)((ulong)*(undefined8 *)(ch_local[2] + 2) >> 0x20);
      local_6c8 = (float)*(undefined8 *)ch_local[6];
      fStack_6c4 = (float)((ulong)*(undefined8 *)ch_local[6] >> 0x20);
      fStack_6c0 = (float)*(undefined8 *)(ch_local[6] + 2);
      fStack_6bc = (float)((ulong)*(undefined8 *)(ch_local[6] + 2) >> 0x20);
      local_6d8 = (float)*(undefined8 *)ch_local[3];
      fStack_6d4 = (float)((ulong)*(undefined8 *)ch_local[3] >> 0x20);
      fStack_6d0 = (float)*(undefined8 *)(ch_local[3] + 2);
      fStack_6cc = (float)((ulong)*(undefined8 *)(ch_local[3] + 2) >> 0x20);
      local_6e8 = (float)*(undefined8 *)ch_local[7];
      fStack_6e4 = (float)((ulong)*(undefined8 *)ch_local[7] >> 0x20);
      fStack_6e0 = (float)*(undefined8 *)(ch_local[7] + 2);
      fStack_6dc = (float)((ulong)*(undefined8 *)(ch_local[7] + 2) >> 0x20);
      *wa1_local = local_678 + local_688 + local_6b8 + local_6c8;
      wa1_local[1] = fStack_674 + fStack_684 + fStack_6b4 + fStack_6c4;
      wa1_local[2] = fStack_670 + fStack_680 + fStack_6b0 + fStack_6c0;
      wa1_local[3] = fStack_66c + fStack_67c + fStack_6ac + fStack_6bc;
      wa1_local[4] = local_698 + local_6a8 + local_6d8 + local_6e8;
      wa1_local[5] = fStack_694 + fStack_6a4 + fStack_6d4 + fStack_6e4;
      wa1_local[6] = fStack_690 + fStack_6a0 + fStack_6d0 + fStack_6e0;
      wa1_local[7] = fStack_68c + fStack_69c + fStack_6cc + fStack_6dc;
      pfVar6 = wa1_local + (long)iVar5 * 4;
      *pfVar6 = (local_18 - local_28) + fVar8;
      pfVar6[1] = (fStack_14 - fStack_24) + fVar12;
      pfVar6[2] = (fStack_10 - fStack_20) + fVar20;
      pfVar6[3] = (fStack_c - fStack_1c) + fVar28;
      pfVar6 = wa1_local + (long)(iVar5 + 1) * 4;
      *pfVar6 = (local_38 - local_48) + fVar7;
      pfVar6[1] = (fStack_34 - fStack_44) + fVar11;
      pfVar6[2] = (fStack_30 - fStack_40) + fVar19;
      pfVar6[3] = (fStack_2c - fStack_3c) + fVar27;
      pfVar6 = wa1_local + (long)(iVar5 * 2) * 4;
      *pfVar6 = (local_678 + local_688) - (local_6b8 + local_6c8);
      pfVar6[1] = (fStack_674 + fStack_684) - (fStack_6b4 + fStack_6c4);
      pfVar6[2] = (fStack_670 + fStack_680) - (fStack_6b0 + fStack_6c0);
      pfVar6[3] = (fStack_66c + fStack_67c) - (fStack_6ac + fStack_6bc);
      pfVar6 = wa1_local + (long)(iVar5 * 2 + 1) * 4;
      *pfVar6 = (local_698 + local_6a8) - (local_6d8 + local_6e8);
      pfVar6[1] = (fStack_694 + fStack_6a4) - (fStack_6d4 + fStack_6e4);
      pfVar6[2] = (fStack_690 + fStack_6a0) - (fStack_6d0 + fStack_6e0);
      pfVar6[3] = (fStack_68c + fStack_69c) - (fStack_6cc + fStack_6dc);
      pfVar6 = wa1_local + (long)(iVar5 * 3) * 4;
      *pfVar6 = (local_18 - local_28) - fVar8;
      pfVar6[1] = (fStack_14 - fStack_24) - fVar12;
      pfVar6[2] = (fStack_10 - fStack_20) - fVar20;
      pfVar6[3] = (fStack_c - fStack_1c) - fVar28;
      pfVar6 = wa1_local + (long)(iVar5 * 3 + 1) * 4;
      *pfVar6 = (local_38 - local_48) - fVar7;
      pfVar6[1] = (fStack_34 - fStack_44) - fVar11;
      pfVar6[2] = (fStack_30 - fStack_40) - fVar19;
      pfVar6[3] = (fStack_2c - fStack_3c) - fVar27;
      wa1_local = wa1_local + 8;
      ch_local = ch_local + 8;
    }
  }
  else {
    for (local_8fc = 0; local_8fc < iVar5; local_8fc = ido + local_8fc) {
      for (local_8f8 = 0; local_8f8 < ido + -1; local_8f8 = local_8f8 + 2) {
        uVar1 = *(undefined8 *)ch_local[local_8f8];
        uVar2 = *(undefined8 *)(ch_local[local_8f8] + 2);
        uVar3 = *(undefined8 *)ch_local[local_8f8 + ido * 2];
        uVar4 = *(undefined8 *)(ch_local[local_8f8 + ido * 2] + 2);
        local_118 = (float)uVar1;
        fStack_114 = (float)((ulong)uVar1 >> 0x20);
        fStack_110 = (float)uVar2;
        fStack_10c = (float)((ulong)uVar2 >> 0x20);
        local_128 = (float)uVar3;
        fStack_124 = (float)((ulong)uVar3 >> 0x20);
        fStack_120 = (float)uVar4;
        fStack_11c = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)ch_local[local_8f8];
        uVar2 = *(undefined8 *)(ch_local[local_8f8] + 2);
        uVar3 = *(undefined8 *)ch_local[local_8f8 + ido * 2];
        uVar4 = *(undefined8 *)(ch_local[local_8f8 + ido * 2] + 2);
        local_778 = (float)uVar1;
        fStack_774 = (float)((ulong)uVar1 >> 0x20);
        fStack_770 = (float)uVar2;
        fStack_76c = (float)((ulong)uVar2 >> 0x20);
        local_788 = (float)uVar3;
        fStack_784 = (float)((ulong)uVar3 >> 0x20);
        fStack_780 = (float)uVar4;
        fStack_77c = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)ch_local[(long)local_8f8 + 1];
        uVar2 = *(undefined8 *)(ch_local[(long)local_8f8 + 1] + 2);
        uVar3 = *(undefined8 *)ch_local[(long)(local_8f8 + ido * 2) + 1];
        uVar4 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido * 2) + 1] + 2);
        local_138 = (float)uVar1;
        fStack_134 = (float)((ulong)uVar1 >> 0x20);
        fStack_130 = (float)uVar2;
        fStack_12c = (float)((ulong)uVar2 >> 0x20);
        local_148 = (float)uVar3;
        fStack_144 = (float)((ulong)uVar3 >> 0x20);
        fStack_140 = (float)uVar4;
        fStack_13c = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)ch_local[(long)local_8f8 + 1];
        uVar2 = *(undefined8 *)(ch_local[(long)local_8f8 + 1] + 2);
        uVar3 = *(undefined8 *)ch_local[(long)(local_8f8 + ido * 2) + 1];
        uVar4 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido * 2) + 1] + 2);
        local_798 = (float)uVar1;
        fStack_794 = (float)((ulong)uVar1 >> 0x20);
        fStack_790 = (float)uVar2;
        fStack_78c = (float)((ulong)uVar2 >> 0x20);
        local_7a8 = (float)uVar3;
        fStack_7a4 = (float)((ulong)uVar3 >> 0x20);
        fStack_7a0 = (float)uVar4;
        fStack_79c = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)ch_local[(long)(local_8f8 + ido * 3) + 1];
        uVar2 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido * 3) + 1] + 2);
        uVar3 = *(undefined8 *)ch_local[(long)(local_8f8 + ido) + 1];
        uVar4 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido) + 1] + 2);
        local_158 = (float)uVar1;
        fStack_154 = (float)((ulong)uVar1 >> 0x20);
        fStack_150 = (float)uVar2;
        fStack_14c = (float)((ulong)uVar2 >> 0x20);
        local_168 = (float)uVar3;
        fStack_164 = (float)((ulong)uVar3 >> 0x20);
        fStack_160 = (float)uVar4;
        fStack_15c = (float)((ulong)uVar4 >> 0x20);
        fVar20 = (local_158 - local_168) * fsign;
        fVar13 = (fStack_154 - fStack_164) * fsign;
        fVar21 = (fStack_150 - fStack_160) * fsign;
        fVar29 = (fStack_14c - fStack_15c) * fsign;
        uVar1 = *(undefined8 *)ch_local[local_8f8 + ido];
        uVar2 = *(undefined8 *)(ch_local[local_8f8 + ido] + 2);
        uVar3 = *(undefined8 *)ch_local[local_8f8 + ido * 3];
        uVar4 = *(undefined8 *)(ch_local[local_8f8 + ido * 3] + 2);
        local_178 = (float)uVar1;
        fStack_174 = (float)((ulong)uVar1 >> 0x20);
        fStack_170 = (float)uVar2;
        fStack_16c = (float)((ulong)uVar2 >> 0x20);
        local_188 = (float)uVar3;
        fStack_184 = (float)((ulong)uVar3 >> 0x20);
        fStack_180 = (float)uVar4;
        fStack_17c = (float)((ulong)uVar4 >> 0x20);
        fVar28 = (local_178 - local_188) * fsign;
        fVar14 = (fStack_174 - fStack_184) * fsign;
        fVar22 = (fStack_170 - fStack_180) * fsign;
        fVar30 = (fStack_16c - fStack_17c) * fsign;
        uVar1 = *(undefined8 *)ch_local[local_8f8 + ido];
        uVar2 = *(undefined8 *)(ch_local[local_8f8 + ido] + 2);
        uVar3 = *(undefined8 *)ch_local[local_8f8 + ido * 3];
        uVar4 = *(undefined8 *)(ch_local[local_8f8 + ido * 3] + 2);
        local_7b8 = (float)uVar1;
        fStack_7b4 = (float)((ulong)uVar1 >> 0x20);
        fStack_7b0 = (float)uVar2;
        fStack_7ac = (float)((ulong)uVar2 >> 0x20);
        local_7c8 = (float)uVar3;
        fStack_7c4 = (float)((ulong)uVar3 >> 0x20);
        fStack_7c0 = (float)uVar4;
        fStack_7bc = (float)((ulong)uVar4 >> 0x20);
        uVar1 = *(undefined8 *)ch_local[(long)(local_8f8 + ido) + 1];
        uVar2 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido) + 1] + 2);
        uVar3 = *(undefined8 *)ch_local[(long)(local_8f8 + ido * 3) + 1];
        uVar4 = *(undefined8 *)(ch_local[(long)(local_8f8 + ido * 3) + 1] + 2);
        local_7d8 = (float)uVar1;
        fStack_7d4 = (float)((ulong)uVar1 >> 0x20);
        fStack_7d0 = (float)uVar2;
        fStack_7cc = (float)((ulong)uVar2 >> 0x20);
        local_7e8 = (float)uVar3;
        fStack_7e4 = (float)((ulong)uVar3 >> 0x20);
        fStack_7e0 = (float)uVar4;
        fStack_7dc = (float)((ulong)uVar4 >> 0x20);
        pfVar6 = wa1_local + (long)local_8f8 * 4;
        *pfVar6 = local_778 + local_788 + local_7b8 + local_7c8;
        pfVar6[1] = fStack_774 + fStack_784 + fStack_7b4 + fStack_7c4;
        pfVar6[2] = fStack_770 + fStack_780 + fStack_7b0 + fStack_7c0;
        pfVar6[3] = fStack_76c + fStack_77c + fStack_7ac + fStack_7bc;
        fVar11 = (local_778 + local_788) - (local_7b8 + local_7c8);
        fVar15 = (fStack_774 + fStack_784) - (fStack_7b4 + fStack_7c4);
        fVar23 = (fStack_770 + fStack_780) - (fStack_7b0 + fStack_7c0);
        fVar31 = (fStack_76c + fStack_77c) - (fStack_7ac + fStack_7bc);
        pfVar6 = wa1_local + (long)local_8f8 * 4 + 4;
        *pfVar6 = local_798 + local_7a8 + local_7d8 + local_7e8;
        pfVar6[1] = fStack_794 + fStack_7a4 + fStack_7d4 + fStack_7e4;
        pfVar6[2] = fStack_790 + fStack_7a0 + fStack_7d0 + fStack_7e0;
        pfVar6[3] = fStack_78c + fStack_79c + fStack_7cc + fStack_7dc;
        fVar12 = (local_798 + local_7a8) - (local_7d8 + local_7e8);
        fVar16 = (fStack_794 + fStack_7a4) - (fStack_7d4 + fStack_7e4);
        fVar24 = (fStack_790 + fStack_7a0) - (fStack_7d0 + fStack_7e0);
        fVar32 = (fStack_78c + fStack_79c) - (fStack_7cc + fStack_7dc);
        fVar19 = (local_118 - local_128) + fVar20;
        fVar17 = (fStack_114 - fStack_124) + fVar13;
        fVar25 = (fStack_110 - fStack_120) + fVar21;
        fVar33 = (fStack_10c - fStack_11c) + fVar29;
        fVar20 = (local_118 - local_128) - fVar20;
        fVar13 = (fStack_114 - fStack_124) - fVar13;
        fVar21 = (fStack_110 - fStack_120) - fVar21;
        fVar29 = (fStack_10c - fStack_11c) - fVar29;
        fVar27 = (local_138 - local_148) + fVar28;
        fVar18 = (fStack_134 - fStack_144) + fVar14;
        fVar26 = (fStack_130 - fStack_140) + fVar22;
        fVar34 = (fStack_12c - fStack_13c) + fVar30;
        fVar28 = (local_138 - local_148) - fVar28;
        fVar14 = (fStack_134 - fStack_144) - fVar14;
        fVar22 = (fStack_130 - fStack_140) - fVar22;
        fVar30 = (fStack_12c - fStack_13c) - fVar30;
        fVar7 = wa1[local_8f8];
        fVar9 = fsign * wa1[(long)local_8f8 + 1];
        fVar8 = wa2[local_8f8];
        fVar10 = fsign * wa2[(long)local_8f8 + 1];
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5) * 4) =
             CONCAT44(fVar17 * fVar7 - fVar18 * fVar9,fVar19 * fVar7 - fVar27 * fVar9);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5) * 4 + 2) =
             CONCAT44(fVar33 * fVar7 - fVar34 * fVar9,fVar25 * fVar7 - fVar26 * fVar9);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5) * 4 + 4) =
             CONCAT44(fVar18 * fVar7 + fVar17 * fVar9,fVar27 * fVar7 + fVar19 * fVar9);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5) * 4 + 4 + 2) =
             CONCAT44(fVar34 * fVar7 + fVar33 * fVar9,fVar26 * fVar7 + fVar25 * fVar9);
        fVar7 = wa3[local_8f8];
        fVar19 = fsign * wa3[(long)local_8f8 + 1];
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 2) * 4) =
             CONCAT44(fVar15 * fVar8 - fVar16 * fVar10,fVar11 * fVar8 - fVar12 * fVar10);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 2) * 4 + 2) =
             CONCAT44(fVar31 * fVar8 - fVar32 * fVar10,fVar23 * fVar8 - fVar24 * fVar10);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 2) * 4 + 4) =
             CONCAT44(fVar16 * fVar8 + fVar15 * fVar10,fVar12 * fVar8 + fVar11 * fVar10);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 2) * 4 + 4 + 2) =
             CONCAT44(fVar32 * fVar8 + fVar31 * fVar10,fVar24 * fVar8 + fVar23 * fVar10);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 3) * 4) =
             CONCAT44(fVar13 * fVar7 - fVar14 * fVar19,fVar20 * fVar7 - fVar28 * fVar19);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 3) * 4 + 2) =
             CONCAT44(fVar29 * fVar7 - fVar30 * fVar19,fVar21 * fVar7 - fVar22 * fVar19);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 3 + 1) * 4) =
             CONCAT44(fVar14 * fVar7 + fVar13 * fVar19,fVar28 * fVar7 + fVar20 * fVar19);
        *(ulong *)(wa1_local + (long)(local_8f8 + iVar5 * 3 + 1) * 4 + 2) =
             CONCAT44(fVar30 * fVar7 + fVar29 * fVar19,fVar22 * fVar7 + fVar21 * fVar19);
      }
      wa1_local = wa1_local + (long)ido * 4;
      ch_local = ch_local + (ido << 2);
    }
  }
  return;
}

Assistant:

static NEVER_INLINE(void) passf4_ps(int ido, int l1, const v4sf *cc, v4sf *ch,
                                    const float *wa1, const float *wa2, const float *wa3, float fsign) {
  /* isign == -1 for forward transform and +1 for backward transform */

  int i, k;
  v4sf ci2, ci3, ci4, cr2, cr3, cr4, ti1, ti2, ti3, ti4, tr1, tr2, tr3, tr4;
  int l1ido = l1*ido;
  if (ido == 2) {
    for (k=0; k < l1ido; k += ido, ch += ido, cc += 4*ido) {
      tr1 = VSUB(cc[0], cc[2*ido + 0]);
      tr2 = VADD(cc[0], cc[2*ido + 0]);
      ti1 = VSUB(cc[1], cc[2*ido + 1]);
      ti2 = VADD(cc[1], cc[2*ido + 1]);
      ti4 = VMUL(VSUB(cc[1*ido + 0], cc[3*ido + 0]), LD_PS1(fsign));
      tr4 = VMUL(VSUB(cc[3*ido + 1], cc[1*ido + 1]), LD_PS1(fsign));
      tr3 = VADD(cc[ido + 0], cc[3*ido + 0]);
      ti3 = VADD(cc[ido + 1], cc[3*ido + 1]);

      ch[0*l1ido + 0] = VADD(tr2, tr3);
      ch[0*l1ido + 1] = VADD(ti2, ti3);
      ch[1*l1ido + 0] = VADD(tr1, tr4);
      ch[1*l1ido + 1] = VADD(ti1, ti4);
      ch[2*l1ido + 0] = VSUB(tr2, tr3);
      ch[2*l1ido + 1] = VSUB(ti2, ti3);        
      ch[3*l1ido + 0] = VSUB(tr1, tr4);
      ch[3*l1ido + 1] = VSUB(ti1, ti4);
    }
  } else {
    for (k=0; k < l1ido; k += ido, ch+=ido, cc += 4*ido) {
      for (i=0; i<ido-1; i+=2) {
        float wr1, wi1, wr2, wi2, wr3, wi3;
        tr1 = VSUB(cc[i + 0], cc[i + 2*ido + 0]);
        tr2 = VADD(cc[i + 0], cc[i + 2*ido + 0]);
        ti1 = VSUB(cc[i + 1], cc[i + 2*ido + 1]);
        ti2 = VADD(cc[i + 1], cc[i + 2*ido + 1]);
        tr4 = VMUL(VSUB(cc[i + 3*ido + 1], cc[i + 1*ido + 1]), LD_PS1(fsign));
        ti4 = VMUL(VSUB(cc[i + 1*ido + 0], cc[i + 3*ido + 0]), LD_PS1(fsign));
        tr3 = VADD(cc[i + ido + 0], cc[i + 3*ido + 0]);
        ti3 = VADD(cc[i + ido + 1], cc[i + 3*ido + 1]);

        ch[i] = VADD(tr2, tr3);
        cr3    = VSUB(tr2, tr3);
        ch[i + 1] = VADD(ti2, ti3);
        ci3 = VSUB(ti2, ti3);

        cr2 = VADD(tr1, tr4);
        cr4 = VSUB(tr1, tr4);
        ci2 = VADD(ti1, ti4);
        ci4 = VSUB(ti1, ti4);
        wr1=wa1[i], wi1=fsign*wa1[i+1];
        VCPLXMUL(cr2, ci2, LD_PS1(wr1), LD_PS1(wi1));
        wr2=wa2[i], wi2=fsign*wa2[i+1]; 
        ch[i + l1ido] = cr2;
        ch[i + l1ido + 1] = ci2;

        VCPLXMUL(cr3, ci3, LD_PS1(wr2), LD_PS1(wi2));
        wr3=wa3[i], wi3=fsign*wa3[i+1]; 
        ch[i + 2*l1ido] = cr3;
        ch[i + 2*l1ido + 1] = ci3;

        VCPLXMUL(cr4, ci4, LD_PS1(wr3), LD_PS1(wi3));
        ch[i + 3*l1ido] = cr4;
        ch[i + 3*l1ido + 1] = ci4;
      }
    }
  }
}